

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_onewaycouple_mri.c
# Opt level: O0

int main(void)

{
  int iVar1;
  FILE *__stream;
  double dVar2;
  N_Vector user_data;
  SUNContext ctx;
  long nff;
  long nfse;
  long nstf;
  long nsts;
  int iout;
  sunrealtype error;
  sunrealtype tout;
  sunrealtype t;
  FILE *UFID;
  MRIStepInnerStepper inner_stepper;
  void *inner_arkode_mem;
  void *arkode_mem;
  N_Vector ytrue;
  N_Vector y;
  int retval;
  sunrealtype w0;
  sunrealtype v0;
  sunrealtype u0;
  sunrealtype hf;
  sunrealtype hs;
  int Nt;
  sunindextype NEQ;
  sunrealtype dTout;
  sunrealtype Tf;
  sunrealtype T0;
  undefined4 in_stack_ffffffffffffff18;
  int in_stack_ffffffffffffff1c;
  N_Vector in_stack_ffffffffffffff20;
  void *returnvalue;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  int local_ac;
  undefined8 local_a8;
  N_Vector ytrue_00;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  long *local_68;
  int local_5c;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  int local_2c;
  undefined8 local_28;
  double local_20;
  N_Vector local_18;
  N_Vector local_10;
  int local_4;
  
  local_4 = 0;
  local_10 = (N_Vector)0x0;
  local_18 = (N_Vector)0x3ff0000000000000;
  local_20 = 0.1;
  local_28 = 3;
  dVar2 = ceil(10.0);
  local_2c = (int)dVar2;
  local_38 = 0x3f50624dd2f1a9fc;
  local_40 = 0x3f1a36e2eb1c432d;
  local_68 = (long *)0x0;
  local_70 = 0;
  local_78 = 0;
  local_80 = 0;
  local_88 = 0;
  local_a8 = 0;
  returnvalue = (void *)0x0;
  local_5c = SUNContext_Create(0,&stack0xffffffffffffff28);
  iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  if (iVar1 == 0) {
    local_48 = 0x3ff0000000000000;
    local_50 = 0;
    local_58 = 0x4000000000000000;
    printf("\nOne way coupling ODE test problem:\n");
    printf("    initial conditions:  u0 = %g,  v0 = %g,  w0 = %g\n",local_48,local_50,local_58);
    printf("    hs = %g,  hf = %g\n\n",local_38,local_40);
    local_68 = (long *)N_VNew_Serial(local_28,returnvalue);
    iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
    if (iVar1 == 0) {
      **(undefined8 **)(*local_68 + 0x10) = local_48;
      *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8) = local_50;
      *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10) = local_58;
      local_70 = N_VClone(local_68);
      local_80 = ARKStepCreate(local_10,ff,0,local_68,returnvalue);
      iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
      if (iVar1 == 0) {
        local_5c = ARKStepSetTableNum(local_80,0xffffffff,0xc);
        iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c
                            );
        if (iVar1 == 0) {
          local_5c = ARKodeSetFixedStep(local_40,local_80);
          iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c);
          if (iVar1 == 0) {
            local_5c = ARKodeCreateMRIStepInnerStepper(local_80,&local_88);
            iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                                 in_stack_ffffffffffffff1c);
            if (iVar1 == 0) {
              local_78 = MRIStepCreate(local_10,fs,0,local_68,local_88,returnvalue);
              iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                                   in_stack_ffffffffffffff1c);
              if (iVar1 == 0) {
                local_5c = ARKodeSetFixedStep(local_38,local_78);
                iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                                     in_stack_ffffffffffffff1c);
                if (iVar1 == 0) {
                  __stream = fopen("ark_onewaycouple_mri_solution.txt","w");
                  fprintf(__stream,"# t u v w maxerr\n");
                  fprintf(__stream," %.16e %.16e %.16e %.16e %.16e\n",local_10,
                          **(undefined8 **)(*local_68 + 0x10),
                          *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8),
                          *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10),local_a8);
                  user_data = (N_Vector)((double)local_10 + local_20);
                  ytrue_00 = local_10;
                  printf("        t           u           v           w       max err\n");
                  printf("   ----------------------------------------------------------\n");
                  printf("  %10.6f  %10.6f  %10.6f  %10.6f  %10.6f\n",ytrue_00,
                         **(undefined8 **)(*local_68 + 0x10),
                         *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8),
                         *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10),local_a8);
                  for (local_ac = 0; local_ac < local_2c; local_ac = local_ac + 1) {
                    local_5c = ARKodeEvolve(user_data,local_78,local_68,&stack0xffffffffffffff68,1);
                    iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                                         in_stack_ffffffffffffff1c);
                    if (iVar1 != 0) break;
                    local_5c = ans((sunrealtype)__stream,ytrue_00,user_data);
                    iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                                         in_stack_ffffffffffffff1c);
                    if (iVar1 != 0) break;
                    local_5c = err(in_stack_ffffffffffffff20,
                                   (N_Vector)
                                   CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                   (sunrealtype *)0x1018a7);
                    iVar1 = check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                                         in_stack_ffffffffffffff1c);
                    if (iVar1 != 0) break;
                    printf("  %10.6f  %10.6f  %10.6f  %10.6f  %10.6f\n",ytrue_00,
                           **(undefined8 **)(*local_68 + 0x10),
                           *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8),
                           *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10),local_a8);
                    fprintf(__stream," %.16e %.16e %.16e %.16e %.16e\n",ytrue_00,
                            **(undefined8 **)(*local_68 + 0x10),
                            *(undefined8 *)(*(long *)(*local_68 + 0x10) + 8),
                            *(undefined8 *)(*(long *)(*local_68 + 0x10) + 0x10),local_a8);
                    in_stack_ffffffffffffff20 = (N_Vector)(local_20 + (double)user_data);
                    if ((double)local_18 < (double)in_stack_ffffffffffffff20) {
                      in_stack_ffffffffffffff20 = local_18;
                    }
                    user_data = in_stack_ffffffffffffff20;
                  }
                  printf("   ----------------------------------------------------------\n");
                  fclose(__stream);
                  local_5c = ARKodeGetNumSteps(local_78,&local_b8);
                  check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c);
                  local_5c = ARKodeGetNumRhsEvals(local_78,0,&local_c8);
                  check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c);
                  local_5c = ARKodeGetNumSteps(local_80,&local_c0);
                  check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c);
                  local_5c = ARKodeGetNumRhsEvals(local_80,0,&local_d0);
                  check_retval(returnvalue,(char *)in_stack_ffffffffffffff20,
                               in_stack_ffffffffffffff1c);
                  printf("\nFinal Solver Statistics:\n");
                  printf("   Steps: nsts = %li, nstf = %li\n",local_b8,local_c0);
                  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n",local_c8,local_d0);
                  N_VDestroy(local_68);
                  N_VDestroy(local_70);
                  ARKodeFree(&local_80);
                  MRIStepInnerStepper_Free(&local_88);
                  ARKodeFree(&local_78);
                  SUNContext_Free(&stack0xffffffffffffff28);
                  local_4 = 0;
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0    = SUN_RCONST(0.0);       /* initial time */
  sunrealtype Tf    = SUN_RCONST(1.0);       /* final time */
  sunrealtype dTout = SUN_RCONST(0.1);       /* time between outputs */
  sunindextype NEQ  = 3;                     /* number of dependent vars. */
  int Nt            = (int)ceil(Tf / dTout); /* number of output times */
  sunrealtype hs    = SUN_RCONST(0.001);     /* slow step size */
  sunrealtype hf    = SUN_RCONST(0.0001);    /* fast step size */
  sunrealtype u0, v0, w0;                    /* initial conditions */

  /* general problem variables */
  int retval;                    /* reusable error-checking flag */
  N_Vector y             = NULL; /* empty vector for the computed solution */
  N_Vector ytrue         = NULL; /* empty vector for the analytic solution */
  void* arkode_mem       = NULL; /* empty ARKode memory structure */
  void* inner_arkode_mem = NULL; /* empty ARKode memory structure */
  MRIStepInnerStepper inner_stepper = NULL; /* inner stepper */
  FILE* UFID;
  sunrealtype t, tout;
  sunrealtype error = SUN_RCONST(0.0);
  int iout;
  long int nsts, nstf, nfse, nff;

  /*
   * Initialization
   */

  /* Create the SUNDIALS context object for this simulation. */
  SUNContext ctx = NULL;
  retval         = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Set the initial contions */
  u0 = SUN_RCONST(1.0);
  v0 = SUN_RCONST(0.0);
  w0 = SUN_RCONST(2.0);

  /* Initial problem output */
  printf("\nOne way coupling ODE test problem:\n");
  printf("    initial conditions:  u0 = %" GSYM ",  v0 = %" GSYM
         ",  w0 = %" GSYM "\n",
         u0, v0, w0);
  printf("    hs = %" GSYM ",  hf = %" GSYM "\n\n", hs, hf);

  /* Create and initialize serial vector for the solution */
  y = N_VNew_Serial(NEQ, ctx);
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }

  NV_Ith_S(y, 0) = u0;
  NV_Ith_S(y, 1) = v0;
  NV_Ith_S(y, 2) = w0;

  /* Create serial vector for the analytic solution */
  ytrue = N_VClone(y);

  /*
   * Create the fast integrator and set options
   */

  /* Initialize the fast integrator. Specify the explicit fast right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, and the
     initial dependent variable vector y. */
  inner_arkode_mem = ARKStepCreate(ff, NULL, T0, y, ctx);
  if (check_retval((void*)inner_arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set the fast method */
  retval = ARKStepSetTableNum(inner_arkode_mem, -1, ARKODE_KNOTH_WOLKE_3_3);
  if (check_retval(&retval, "ARKStepSetTableNum", 1)) { return 1; }

  /* Set the fast step size */
  retval = ARKodeSetFixedStep(inner_arkode_mem, hf);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /* Create inner stepper */
  retval = ARKodeCreateMRIStepInnerStepper(inner_arkode_mem, &inner_stepper);
  if (check_retval(&retval, "ARKodeCreateMRIStepInnerStepper", 1)) { return 1; }

  /*
   * Create the slow integrator and set options
   */

  /* Initialize the slow integrator. Specify the explicit slow right-hand side
     function in y'=fe(t,y)+fi(t,y)+ff(t,y), the initial time T0, the
     initial dependent variable vector y, and the fast integrator. */
  arkode_mem = MRIStepCreate(fs, NULL, T0, y, inner_stepper, ctx);
  if (check_retval((void*)arkode_mem, "MRIStepCreate", 0)) { return 1; }

  /* Set the slow step size */
  retval = ARKodeSetFixedStep(arkode_mem, hs);
  if (check_retval(&retval, "ARKodeSetFixedStep", 1)) { return 1; }

  /*
   * Integrate ODE
   */

  /* Open output stream for results, output comment line */
  UFID = fopen("ark_onewaycouple_mri_solution.txt", "w");
  fprintf(UFID, "# t u v w maxerr\n");

  /* output initial condition to disk */
  fprintf(UFID,
          " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n",
          T0, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

  /* Main time-stepping loop: calls ARKodeEvolve to perform the
     integration, then prints results. Stops when the final time
     has been reached */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u           v           w       max err\n");
  printf("   ----------------------------------------------------------\n");
  printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
         "  %10.6" FSYM "\n",
         t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

  for (iout = 0; iout < Nt; iout++)
  {
    /* call integrator */
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL);
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }

    /* compute the analytic solution */
    retval = ans(t, ytrue, NULL);
    if (check_retval(&retval, "ans", 1)) { break; }

    /* compute the error compared to the analytic solution */
    retval = err(y, ytrue, &error);
    if (check_retval(&retval, "err", 1)) { break; }

    /* access/print solution and error */
    printf("  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM "  %10.6" FSYM
           "  %10.6" FSYM "\n",
           t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);
    fprintf(UFID,
            " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM " %.16" ESYM "\n",
            t, NV_Ith_S(y, 0), NV_Ith_S(y, 1), NV_Ith_S(y, 2), error);

    /* successful solve: update time */
    tout += dTout;
    tout = (tout > Tf) ? Tf : tout;
  }
  printf("   ----------------------------------------------------------\n");
  fclose(UFID);

  /*
   * Finalize
   */

  /* Get some slow integrator statistics */
  retval = ARKodeGetNumSteps(arkode_mem, &nsts);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(arkode_mem, 0, &nfse);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Get some fast integrator statistics */
  retval = ARKodeGetNumSteps(inner_arkode_mem, &nstf);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumRhsEvals(inner_arkode_mem, 0, &nff);
  check_retval(&retval, "ARKodeGetNumRhsEvals", 1);

  /* Print some final statistics */
  printf("\nFinal Solver Statistics:\n");
  printf("   Steps: nsts = %li, nstf = %li\n", nsts, nstf);
  printf("   Total RHS evals:  Fs = %li,  Ff = %li\n", nfse, nff);

  /* Clean up and return */
  N_VDestroy(y);                            /* Free y vector */
  N_VDestroy(ytrue);                        /* Free ytrue vector */
  ARKodeFree(&inner_arkode_mem);            /* Free integrator memory */
  MRIStepInnerStepper_Free(&inner_stepper); /* Free inner stepper */
  ARKodeFree(&arkode_mem);                  /* Free integrator memory */
  SUNContext_Free(&ctx);                    /* Free context */

  return 0;
}